

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          f)

{
  BoundArgFunction<Catch::ConfigData> local_20;
  offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18
  ;
  offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> f_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  local_18 = f;
  f_local = (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
             )this;
  Detail::makeBoundField<Catch::ConfigData,std::__cxx11::string>((Detail *)&local_20,f);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=(&this->m_boundProcessName,&local_20);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&local_20);
  return;
}

Assistant:

void bindProcessName( F f ) {
            m_boundProcessName = Detail::makeBoundField( f );
        }